

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::operator*(APInt *this,APInt *RHS)

{
  uint numBits;
  uint parts;
  WordType *dst;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  APInt AVar2;
  
  numBits = RHS->BitWidth;
  if (numBits == *(uint *)(in_RDX + 1)) {
    if (numBits < 0x41) {
      APInt(this,numBits,*in_RDX * (RHS->U).VAL,false);
      uVar1 = extraout_RDX;
    }
    else {
      parts = (uint)((ulong)numBits + 0x3f >> 6);
      dst = (WordType *)operator_new__((ulong)(parts * 8));
      this->BitWidth = numBits;
      (this->U).pVal = dst;
      tcMultiply(dst,(RHS->U).pVal,(WordType *)*in_RDX,parts);
      dst[parts - 1] = (dst[parts - 1] << (-(char)numBits & 0x3fU)) >> (-(char)numBits & 0x3fU);
      uVar1 = extraout_RDX_00;
    }
    AVar2._8_8_ = uVar1;
    AVar2.U.pVal = (uint64_t *)this;
    return AVar2;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0xe6,"APInt llvm::APInt::operator*(const APInt &) const");
}

Assistant:

APInt APInt::operator*(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    return APInt(BitWidth, U.VAL * RHS.U.VAL);

  APInt Result(getMemory(getNumWords()), getBitWidth());

  tcMultiply(Result.U.pVal, U.pVal, RHS.U.pVal, getNumWords());

  Result.clearUnusedBits();
  return Result;
}